

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void and_EvGv(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
    (pMyDisasm->Prefix).LockPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10003;
  strcpy((pMyDisasm->Instruction).Mnemonic,"and");
  EvGv(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  FillFlags(pMyDisasm,6);
  return;
}

Assistant:

void __bea_callspec__ and_EvGv(PDISASM pMyDisasm)
{
    if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
        pMyDisasm->Prefix.LockPrefix = InUsePrefix;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+LOGICAL_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "and");
    #endif
    EvGv(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
    FillFlags(pMyDisasm,6);
}